

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O0

int Mio_ParseCheckName(Mio_Gate_t *pGate,char **ppStr)

{
  int iVar1;
  char *__s2;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *local_30;
  char *pNameBest;
  int iBest;
  int i;
  Mio_Pin_t *pPin;
  char **ppStr_local;
  Mio_Gate_t *pGate_local;
  
  pNameBest._0_4_ = -1;
  local_30 = (char *)0x0;
  _iBest = Mio_GateReadPins(pGate);
  pNameBest._4_4_ = 0;
  do {
    if (_iBest == (Mio_Pin_t *)0x0) {
      if (local_30 != (char *)0x0) {
        sVar2 = strlen(local_30);
        *ppStr = *ppStr + (sVar2 - 1);
      }
      return (int)pNameBest;
    }
    pcVar3 = *ppStr;
    __s2 = Mio_PinReadName(_iBest);
    __s = Mio_PinReadName(_iBest);
    sVar2 = strlen(__s);
    iVar1 = strncmp(pcVar3,__s2,sVar2);
    if (iVar1 == 0) {
      if (local_30 != (char *)0x0) {
        sVar2 = strlen(local_30);
        pcVar3 = Mio_PinReadName(_iBest);
        sVar4 = strlen(pcVar3);
        if (sVar4 <= sVar2) goto LAB_0041a742;
      }
      local_30 = Mio_PinReadName(_iBest);
      pNameBest._0_4_ = pNameBest._4_4_;
    }
LAB_0041a742:
    _iBest = Mio_PinReadNext(_iBest);
    pNameBest._4_4_ = pNameBest._4_4_ + 1;
  } while( true );
}

Assistant:

int Mio_ParseCheckName( Mio_Gate_t * pGate, char ** ppStr )
{
    Mio_Pin_t * pPin;
    int i, iBest = -1;
    // find the longest pin name that matches substring
    char * pNameBest = NULL;
    for ( pPin = Mio_GateReadPins(pGate), i = 0; pPin; pPin = Mio_PinReadNext(pPin), i++ )
        if ( !strncmp( *ppStr, Mio_PinReadName(pPin), strlen(Mio_PinReadName(pPin)) ) )
            if ( pNameBest == NULL || strlen(pNameBest) < strlen(Mio_PinReadName(pPin)) )
                pNameBest = Mio_PinReadName(pPin), iBest = i;
    // if pin is not found, return -1
    if ( pNameBest )
        *ppStr += strlen(pNameBest) - 1;
    return iBest;
}